

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  size_type *psVar1;
  char *pcVar2;
  char *__s;
  element_type **__s_00;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  istream *piVar6;
  undefined8 *puVar7;
  long *plVar8;
  FILE *__s_01;
  uint *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  int err;
  int err_00;
  byte bVar11;
  LogStream *pLVar12;
  long lVar13;
  undefined8 uVar14;
  ulong uVar15;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var16;
  string *psVar17;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var18;
  string *psVar19;
  string s;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string logmailer;
  ostringstream sanitized_dests;
  istringstream ss;
  allocator<char> local_4da;
  allocator<char> local_4d9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  ulong local_4d0;
  string local_4c8;
  undefined7 uStack_4c7;
  string local_4b8;
  undefined1 local_498 [8];
  LogMessageData *pLStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488 [5];
  char *local_438;
  long *local_430;
  long local_428;
  long local_420;
  char acStack_418 [8];
  ulong *local_410;
  long local_408;
  ulong local_400 [2];
  string local_3f0;
  string local_3d0;
  char *local_3b0;
  long local_3a8;
  char local_3a0;
  char acStack_39f [15];
  char *local_390;
  element_type **local_388 [2];
  element_type *local_378 [2];
  string local_368;
  string local_348;
  undefined1 local_328 [16];
  _func_int *local_318 [12];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    local_328._0_8_ = local_318;
    sVar5 = strlen(dest);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,dest,dest + sVar5);
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_328,_S_in);
    if ((_func_int **)local_328._0_8_ != local_318) {
      operator_delete((void *)local_328._0_8_,(ulong)(local_318[0] + 1));
    }
    local_438 = subject;
    local_390 = body;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    local_4d8._M_current = (char *)&local_4c8;
    local_4d0 = 0;
    local_4c8 = (string)0x0;
    while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1b0,(string *)&local_4d8,','),
          _Var16._M_current = local_4d8._M_current,
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      psVar19 = (string *)(local_4d8._M_current + local_4d0);
      _Var18._M_current = local_4d8._M_current;
      if (0 < (long)local_4d0 >> 2) {
        _Var18._M_current = local_4d8._M_current + (local_4d0 & 0xfffffffffffffffc);
        lVar13 = ((long)local_4d0 >> 2) + 1;
        psVar17 = (string *)(local_4d8._M_current + 3);
        do {
          iVar4 = isspace((int)(char)psVar17[-3]);
          if (iVar4 == 0) {
            psVar17 = psVar17 + -3;
            goto LAB_0010b6c7;
          }
          iVar4 = isspace((int)(char)psVar17[-2]);
          if (iVar4 == 0) {
            psVar17 = psVar17 + -2;
            goto LAB_0010b6c7;
          }
          iVar4 = isspace((int)(char)psVar17[-1]);
          if (iVar4 == 0) {
            psVar17 = psVar17 + -1;
            goto LAB_0010b6c7;
          }
          iVar4 = isspace((int)(char)psVar17->field_0x0);
          if (iVar4 == 0) goto LAB_0010b6c7;
          lVar13 = lVar13 + -1;
          psVar17 = psVar17 + 4;
        } while (1 < lVar13);
      }
      lVar13 = (long)psVar19 - (long)_Var18._M_current;
      if (lVar13 == 1) {
LAB_0010b6a4:
        iVar4 = isspace((int)(char)((string *)_Var18._M_current)->field_0x0);
        psVar17 = (string *)_Var18._M_current;
        if (iVar4 != 0) {
          psVar17 = psVar19;
        }
LAB_0010b6c7:
        if (psVar19 == psVar17) goto LAB_0010b6e0;
        std::__cxx11::string::_M_erase((ulong)&local_4d8,0);
      }
      else {
        if (lVar13 == 2) {
LAB_0010b694:
          iVar4 = isspace((int)(char)((string *)_Var18._M_current)->field_0x0);
          psVar17 = (string *)_Var18._M_current;
          if (iVar4 != 0) {
            _Var18._M_current = _Var18._M_current + 1;
            goto LAB_0010b6a4;
          }
          goto LAB_0010b6c7;
        }
        if (lVar13 == 3) {
          iVar4 = isspace((int)(char)((string *)_Var18._M_current)->field_0x0);
          psVar17 = (string *)_Var18._M_current;
          if (iVar4 != 0) {
            _Var18._M_current = _Var18._M_current + 1;
            goto LAB_0010b694;
          }
          goto LAB_0010b6c7;
        }
LAB_0010b6e0:
        local_4d0 = 0;
        *_Var16._M_current = '\0';
      }
      dest = local_4d8._M_current;
      psVar19 = (string *)(local_4d8._M_current + local_4d0);
      lVar13 = (long)local_4d0 >> 2;
      psVar17 = psVar19;
      if (0 < lVar13) {
        psVar17 = psVar19 + -(local_4d0 & 0xfffffffffffffffc);
        psVar19 = psVar19 + lVar13 * -4;
        lVar13 = lVar13 + 1;
        uVar15 = local_4d0;
        do {
          iVar4 = isspace((int)(char)*(string *)(dest + (uVar15 - 1)));
          if (iVar4 == 0) {
            _Var16._M_current = (char *)(dest + uVar15);
            goto LAB_0010b802;
          }
          iVar4 = isspace((int)(char)*(string *)(dest + (uVar15 - 2)));
          if (iVar4 == 0) {
            _Var16._M_current = (char *)(dest + (uVar15 - 1));
            goto LAB_0010b802;
          }
          iVar4 = isspace((int)(char)*(string *)(dest + (uVar15 - 3)));
          if (iVar4 == 0) {
            _Var16._M_current = (char *)(dest + (uVar15 - 2));
            goto LAB_0010b802;
          }
          iVar4 = isspace((int)(char)*(string *)(dest + (uVar15 - 4)));
          if (iVar4 == 0) {
            _Var16._M_current = (char *)(dest + (uVar15 - 3));
            goto LAB_0010b802;
          }
          uVar15 = uVar15 - 4;
          lVar13 = lVar13 + -1;
        } while (1 < lVar13);
      }
      lVar13 = (long)psVar17 - (long)dest;
      if (lVar13 == 1) {
LAB_0010b7d0:
        iVar4 = isspace((int)(char)psVar17[-1]);
        _Var16._M_current = (char *)psVar17;
        if (iVar4 != 0) {
          _Var16._M_current = dest;
        }
      }
      else if (lVar13 == 2) {
LAB_0010b7b9:
        iVar4 = isspace((int)(char)psVar17[-1]);
        _Var16._M_current = (char *)psVar17;
        if (iVar4 != 0) {
          psVar17 = psVar19 + -1;
          goto LAB_0010b7d0;
        }
      }
      else {
        _Var16._M_current = dest;
        if ((lVar13 == 3) &&
           (iVar4 = isspace((int)(char)psVar17[-1]), _Var16._M_current = (char *)psVar17, iVar4 != 0
           )) {
          psVar17 = psVar19 + -1;
          psVar19 = psVar17;
          goto LAB_0010b7b9;
        }
      }
LAB_0010b802:
      local_4d0 = (long)_Var16._M_current - (long)dest;
      ((string *)_Var16._M_current)->field_0x0 = 0;
      if (local_4d0 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_388,
                   "^[a-zA-Z0-9][a-zA-Z0-9.!#$%&\'*+/=?^_`{|}~-]*@[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"
                   ,0x10);
        local_488[0]._M_allocated_capacity = (pointer)0x0;
        local_488[0]._8_8_ = (char *)0x0;
        local_498 = (undefined1  [8])0x0;
        pLStack_490 = (LogMessageData *)0x0;
        bVar3 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (local_4d8,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_4d8._M_current + local_4d0),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_498,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_388,0);
        if (local_498 != (undefined1  [8])0x0) {
          operator_delete((void *)local_498,local_488[0]._M_allocated_capacity - (long)local_498);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_388);
        if (!bVar3) {
          if (use_logging) {
            if (SendEmailInternal::vlocal__.level == (int32 *)0x0) {
              bVar3 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                                  ,1);
              if (bVar3) goto LAB_0010ba19;
            }
            else if (0 < *SendEmailInternal::vlocal__.level) {
LAB_0010ba19:
              LogMessage::LogMessage
                        ((LogMessage *)local_498,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                         ,0x88e);
              pLVar12 = &pLStack_490->stream_;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pLVar12->super_ostream,"Invalid destination email address:",0x22);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pLVar12->super_ostream,local_4d8._M_current,local_4d0);
              LogMessage::~LogMessage((LogMessage *)local_498);
            }
          }
          else {
            SendEmailInternal();
          }
          bVar3 = false;
          bVar11 = 0;
          goto LAB_0010c1c2;
        }
        std::__cxx11::stringbuf::str();
        dest = (char *)pLStack_490;
        if (local_498 != (undefined1  [8])local_488) {
          operator_delete((void *)local_498,(ulong)(local_488[0]._M_allocated_capacity + 1));
        }
        if ((LogMessageData *)dest != (LogMessageData *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,",",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,local_4d8._M_current,local_4d0);
      }
    }
    std::__cxx11::stringbuf::str();
    __s_00 = local_388[0];
    __s = local_390;
    if (use_logging) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        bVar3 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                            ,1);
        if (bVar3) goto LAB_0010b996;
      }
      else if (0 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level) {
LAB_0010b996:
        LogMessage::LogMessage
                  ((LogMessage *)local_498,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x89e);
        dest = (char *)&pLStack_490->stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)dest,"Trying to send TITLE:",0x15);
        pcVar2 = local_438;
        iVar4 = (int)dest;
        if (local_438 == (char *)0x0) {
          std::ios::clear(iVar4 + (int)(((LogStream *)dest)->super_ostream)._vptr_basic_ostream[-3])
          ;
        }
        else {
          sVar5 = strlen(local_438);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)dest,pcVar2,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)dest," BODY:",6);
        if (__s == (char *)0x0) {
          std::ios::clear(iVar4 + (int)(((LogStream *)dest)->super_ostream)._vptr_basic_ostream[-3])
          ;
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)dest,__s,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)dest," to ",4);
        if (__s_00 == (element_type **)0x0) {
          std::ios::clear(iVar4 + (int)(((LogStream *)dest)->super_ostream)._vptr_basic_ostream[-3])
          ;
        }
        else {
          sVar5 = strlen((char *)__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)dest,(char *)__s_00,sVar5);
        }
        LogMessage::~LogMessage((LogMessage *)local_498);
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",local_438,local_390,local_388[0]);
    }
    local_3a8 = 0;
    local_3a0 = '\0';
    local_3b0 = &local_3a0;
    if (fLS::FLAGS_logmailer_buf_abi_cxx11_._8_8_ == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_3b0,0,(char *)0x0,0x121ce7);
    }
    else {
      ShellEscape((string *)local_498,(string *)fLS::FLAGS_logmailer_buf_abi_cxx11_);
      dest = local_498;
      std::__cxx11::string::operator=((string *)&local_3b0,(string *)dest);
      if (local_498 != (undefined1  [8])local_488) {
        operator_delete((void *)local_498,(ulong)(local_488[0]._M_allocated_capacity + 1));
      }
    }
    local_410 = local_400;
    std::__cxx11::string::_M_construct<char*>((string *)&local_410,local_3b0,local_3b0 + local_3a8);
    std::__cxx11::string::append((char *)&local_410);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,local_438,&local_4d9);
    ShellEscape(&local_3d0,&local_348);
    uVar15 = 0xf;
    if (local_410 != local_400) {
      uVar15 = local_400[0];
    }
    if (uVar15 < local_3d0._M_string_length + local_408) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        uVar14 = local_3d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_3d0._M_string_length + local_408) goto LAB_0010bc6a;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_410);
    }
    else {
LAB_0010bc6a:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_3d0._M_dataplus._M_p)
      ;
    }
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    psVar1 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_4b8.field_2._M_allocated_capacity = *psVar1;
      local_4b8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_4b8.field_2._M_allocated_capacity = *psVar1;
      local_4b8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_4b8._M_string_length = puVar7[1];
    *puVar7 = psVar1;
    puVar7[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_4b8);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar10) {
      local_488[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_488[0]._8_8_ = plVar8[3];
      local_498 = (undefined1  [8])local_488;
    }
    else {
      local_488[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_498 = (undefined1  [8])*plVar8;
    }
    pLStack_490 = (LogMessageData *)plVar8[1];
    *plVar8 = (long)paVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,(char *)__s_00,&local_4da);
    ShellEscape(&local_3f0,&local_368);
    uVar14 = (pointer)0xf;
    if (local_498 != (undefined1  [8])local_488) {
      uVar14 = local_488[0]._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (pointer)(pLStack_490->message_text_ + (local_3f0._M_string_length - 4))) {
      uVar14 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        uVar14 = local_3f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (pointer)(pLStack_490->message_text_ + (local_3f0._M_string_length - 4)))
      goto LAB_0010bda0;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,(ulong)local_498);
    }
    else {
LAB_0010bda0:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append(local_498,(ulong)local_3f0._M_dataplus._M_p);
    }
    local_430 = &local_420;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_420 = *plVar8;
      acStack_418 = (char  [8])puVar7[3];
    }
    else {
      local_420 = *plVar8;
      local_430 = (long *)*puVar7;
    }
    local_428 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      (ulong)(local_3f0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_498 != (undefined1  [8])local_488) {
      operator_delete((void *)local_498,(ulong)(local_488[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    if (use_logging) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        bVar3 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                            ,4);
        if (bVar3) goto LAB_0010bf60;
      }
      else if (3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level) {
LAB_0010bf60:
        LogMessage::LogMessage
                  ((LogMessage *)local_498,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8b1);
        pLVar12 = &pLStack_490->stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar12->super_ostream,"Mailing command: ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pLVar12->super_ostream,(char *)local_430,local_428);
        LogMessage::~LogMessage((LogMessage *)local_498);
      }
      __s_01 = popen((char *)local_430,"w");
      if (__s_01 == (FILE *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)local_498,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8c7,ERROR);
        dest = (char *)&pLStack_490->stream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)dest,"Unable to send mail to ",0x17);
        if (__s_00 == (element_type **)0x0) {
          std::ios::clear((int)dest +
                          (int)(((LogStream *)dest)->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar5 = strlen((char *)__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)dest,(char *)__s_00,sVar5);
        }
        LogMessage::~LogMessage((LogMessage *)local_498);
        goto LAB_0010c160;
      }
LAB_0010bfd3:
      if (__s != (char *)0x0) {
        sVar5 = strlen(__s);
        fwrite(__s,1,sVar5,__s_01);
      }
      iVar4 = pclose(__s_01);
      if (iVar4 == -1) {
        if (use_logging) {
          LogMessage::LogMessage
                    ((LogMessage *)local_498,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                     ,0x8bd,ERROR);
          pLVar12 = &pLStack_490->stream_;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar12->super_ostream,"Problems sending mail to ",0x19);
          if (__s_00 == (element_type **)0x0) {
            std::ios::clear((int)pLVar12 + (int)(pLVar12->super_ostream)._vptr_basic_ostream[-3]);
          }
          else {
            sVar5 = strlen((char *)__s_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pLVar12->super_ostream,(char *)__s_00,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream,": ",2);
          puVar9 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_4b8,(google *)(ulong)*puVar9,err);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pLVar12->super_ostream,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
          }
          LogMessage::~LogMessage((LogMessage *)local_498);
        }
        else {
          puVar9 = (uint *)__errno_location();
          StrError_abi_cxx11_((string *)local_498,(google *)(ulong)*puVar9,err_00);
          SendEmailInternal();
        }
        bVar3 = false;
        bVar11 = 0;
      }
      else {
        bVar11 = 1;
        bVar3 = false;
      }
    }
    else {
      __s_01 = popen((char *)local_430,"w");
      if (__s_01 != (FILE *)0x0) goto LAB_0010bfd3;
      fprintf(_stderr,"Unable to send mail to %s\n",__s_00);
LAB_0010c160:
      bVar11 = (byte)dest;
      bVar3 = true;
    }
    if (local_430 != &local_420) {
      operator_delete(local_430,local_420 + 1);
    }
    if (local_3b0 != &local_3a0) {
      operator_delete(local_3b0,CONCAT71(acStack_39f._0_7_,local_3a0) + 1);
    }
    if (local_388[0] != local_378) {
      operator_delete(local_388[0],
                      (ulong)((long)&(local_378[0]->super__NFA_base)._M_paren_stack.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
LAB_0010c1c2:
    if ((string *)local_4d8._M_current != &local_4c8) {
      operator_delete(local_4d8._M_current,CONCAT71(uStack_4c7,local_4c8) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base(local_2b8);
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if (!bVar3) goto LAB_0010c227;
  }
  bVar11 = 0;
LAB_0010c227:
  return (bool)(bVar11 & 1);
}

Assistant:

static bool SendEmailInternal(const char* dest, const char* subject,
                              const char* body, bool use_logging) {
#ifndef GLOG_OS_EMSCRIPTEN
  if (dest && *dest) {
    // Split the comma-separated list of email addresses, validate each one and
    // build a sanitized new comma-separated string without whitespace.
    std::istringstream ss(dest);
    std::ostringstream sanitized_dests;
    std::string s;
    while (std::getline(ss, s, ',')) {
      trim(s);
      if (s.empty()) {
        continue;
      }
      // We validate the provided email addresses using the same regular
      // expression that HTML5 uses[1], except that we require the address to
      // start with an alpha-numeric character. This is because we don't want to
      // allow email addresses that start with a special character, such as a
      // pipe or dash, which could be misunderstood as a command-line flag by
      // certain versions of `mail` that are vulnerable to command injection.[2]
      // [1]
      // https://html.spec.whatwg.org/multipage/input.html#valid-e-mail-address
      // [2] e.g. https://nvd.nist.gov/vuln/detail/CVE-2004-2771
      if (!std::regex_match(
              s,
              std::regex("^[a-zA-Z0-9]"
                         "[a-zA-Z0-9.!#$%&'*+/=?^_`{|}~-]*@[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"))) {
        if (use_logging) {
          VLOG(1) << "Invalid destination email address:" << s;
        } else {
          fprintf(stderr, "Invalid destination email address: %s\n", s.c_str());
        }
        return false;
      }
      if (!sanitized_dests.str().empty()) {
        sanitized_dests << ",";
      }
      sanitized_dests << s;
    }
    // Avoid dangling reference
    const std::string& tmp = sanitized_dests.str();
    dest = tmp.c_str();

    if (use_logging) {
      VLOG(1) << "Trying to send TITLE:" << subject << " BODY:" << body
              << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n", subject,
              body, dest);
    }

    string logmailer;

    if (FLAGS_logmailer.empty()) {
      // Don't need to shell escape the literal string
      logmailer = "/bin/mail";
    } else {
      logmailer = ShellEscape(FLAGS_logmailer);
    }

    string cmd =
        logmailer + " -s" + ShellEscape(subject) + " " + ShellEscape(dest);
    if (use_logging) {
      VLOG(4) << "Mailing command: " << cmd;
    }

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != nullptr) {
      // Add the body if we have one
      if (body) {
        fwrite(body, sizeof(char), strlen(body), pipe);
      }
      bool ok = pclose(pipe) != -1;
      if (!ok) {
        if (use_logging) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n", dest,
                  StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if (use_logging) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
#else
  (void)dest;
  (void)subject;
  (void)body;
  (void)use_logging;
  LOG(WARNING) << "Email support not available; not sending message";
#endif
  return false;
}